

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vec)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  pointer pnVar4;
  undefined8 uVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  long lVar7;
  ulong uVar8;
  cpp_dec_float<50U,_int,_void> *v;
  uint uVar9;
  ulong uVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (vec->setupStatus == true) {
    lVar7 = (long)(vec->super_IdxSet).num;
    if (0 < lVar7) {
      piVar3 = (vec->super_IdxSet).idx;
      uVar8 = lVar7 + 1;
      do {
        iVar2 = piVar3[uVar8 - 2];
        pnVar4 = (vec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_68.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 0x20);
        local_68.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar2].m_backend.data;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
        local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_68.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_68.exp = pnVar4[iVar2].m_backend.exp;
        local_68.neg = pnVar4[iVar2].m_backend.neg;
        local_68.fpclass = pnVar4[iVar2].m_backend.fpclass;
        local_68.prec_elem = pnVar4[iVar2].m_backend.prec_elem;
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8.data._M_elems[9]._1_3_ = 0;
        local_a8.exp = 0;
        local_a8.neg = false;
        if (&local_a8 != &x->m_backend) {
          uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 8);
          local_a8.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)(x->m_backend).data._M_elems;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 2);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 4);
          uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 6);
          local_a8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_a8.exp = (x->m_backend).exp;
          local_a8.neg = (x->m_backend).neg;
          local_a8.fpclass = (x->m_backend).fpclass;
          local_a8.prec_elem = (x->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_a8,&local_68);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)((long)piVar3[uVar8 - 2] * 0x38 + *(long *)this)
                   ,&local_a8);
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
  }
  else {
    uVar9 = (int)(*(long *)(this + 8) - *(long *)this >> 3) * -0x49249249;
    if (0 < (int)uVar9) {
      uVar8 = (ulong)(uVar9 & 0x7fffffff);
      uVar10 = uVar8 + 1;
      lVar7 = uVar8 * 0x38;
      do {
        pcVar6 = (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(vec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar7);
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8.data._M_elems[9]._1_3_ = 0;
        local_a8.exp = 0;
        local_a8.neg = false;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        v = pcVar6;
        if (pcVar6 == &local_a8) {
          v = &x->m_backend;
        }
        if (pcVar6 != &local_a8 && &local_a8 != &x->m_backend) {
          uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 8);
          local_a8.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)(x->m_backend).data._M_elems;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 2);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 4);
          uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 6);
          local_a8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_a8.exp = (x->m_backend).exp;
          local_a8.neg = (x->m_backend).neg;
          local_a8.fpclass = (x->m_backend).fpclass;
          local_a8.prec_elem = (x->m_backend).prec_elem;
          v = pcVar6;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,v);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)(*(long *)this + lVar7 + -0x38),&local_a8);
        uVar10 = uVar10 - 1;
        lVar7 = lVar7 + -0x38;
      } while (1 < uVar10);
    }
  }
  return (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
VectorBase<R>& VectorBase<R>::multAdd(const S& x, const SSVectorBase<T>& vec)
{
   assert(vec.dim() <= dim());

   if(vec.isSetup())
   {
      const int* idx = vec.indexMem();

      for(int i = vec.size() - 1; i >= 0; --i)
         val[idx[i]] += x * vec[idx[i]];
   }
   else
   {
      assert(vec.dim() == dim());

      for(int i = dim() - 1; i >= 0; --i)
         val[i] += x * vec.val[i];
   }

   return *this;
}